

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aegis256.cc
# Opt level: O1

int aead_aegis_256_open_gather
              (EVP_AEAD_CTX *ctx,uint8_t *out,uint8_t *nonce,size_t nonce_len,uint8_t *in,
              size_t in_len,uint8_t *in_tag,size_t in_tag_len,uint8_t *ad,size_t ad_len)

{
  undefined1 (*pauVar1) [16];
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int line;
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  aes_block_t tmp;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  uint8_t src [16];
  aes_block_t local_140;
  undefined1 auStack_130 [16];
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  aes_block_t local_d0;
  undefined1 local_c0 [16];
  size_t local_a8;
  undefined1 local_a0 [16];
  undefined1 local_90 [6] [16];
  
  if (nonce_len < 0x21) {
    if (ctx->tag_len == in_tag_len) {
      local_a8 = (ulong)ctx->tag_len;
      aegis_256_state_init((ctx->state).opaque,nonce,nonce_len,&local_140);
      if (ad_len < 0x10) {
        lVar4 = 0;
      }
      else {
        auVar25 = ZEXT1664(auStack_130);
        auVar10 = ZEXT1664(local_120);
        auVar7 = ZEXT1664(auStack_110);
        auVar20 = ZEXT1664(local_100);
        auVar13 = ZEXT1664(auStack_f0);
        lVar3 = 0;
        do {
          auVar19 = auVar25._0_16_;
          auVar16 = auVar20._0_16_;
          auVar12 = auVar13._0_16_;
          auVar6 = auVar10._0_16_;
          auVar23 = auVar7._0_16_;
          pauVar1 = (undefined1 (*) [16])(ad + lVar3);
          auStack_f0 = aesenc(auVar16,auVar12);
          auVar13._0_32_ = ZEXT1632(auStack_f0);
          local_100 = aesenc(auVar23,auVar16);
          auVar20._0_32_ = ZEXT1632(local_100);
          auStack_110 = aesenc(auVar6,auVar23);
          auVar7._0_32_ = ZEXT1632(auStack_110);
          local_120 = aesenc(auVar19,auVar6);
          auVar10._0_32_ = ZEXT1632(local_120);
          auStack_130 = aesenc((undefined1  [16])local_140,auVar19);
          auVar25._0_32_ = ZEXT1632(auStack_130);
          auVar24 = aesenc(auVar12,(undefined1  [16])local_140);
          local_140 = (aes_block_t)(auVar24 ^ *pauVar1);
          lVar4 = lVar3 + 0x10;
          uVar5 = lVar3 + 0x20;
          lVar3 = lVar4;
        } while (uVar5 <= ad_len);
        auVar23 = vpand_avx(auVar6,auVar23);
        local_c0 = *pauVar1 ^ auVar12 ^ auVar16 ^ auVar23 ^ auVar19;
      }
      if ((ad_len & 0xf) != 0) {
        local_90[0] = (undefined1  [16])0x0;
        local_d0 = local_140;
        memcpy(local_90,ad + lVar4,ad_len & 0xf);
      }
      if (in_len < 0x10) {
        lVar4 = 0;
      }
      else {
        auVar14 = ZEXT1664(auStack_130);
        auVar11 = ZEXT1664(local_120);
        auVar8 = ZEXT1664(auStack_110);
        auVar17 = ZEXT1664(local_100);
        auVar21 = ZEXT1664(auStack_f0);
        lVar3 = 0;
        do {
          auVar6 = auVar8._0_16_;
          auVar12 = auVar11._0_16_;
          auVar23 = vpand_avx(auVar12,auVar6);
          auVar19 = auVar17._0_16_;
          auVar24 = auVar21._0_16_;
          auVar16 = auVar14._0_16_;
          auVar23 = auVar23 ^ *(undefined1 (*) [16])(in + lVar3) ^ auVar24 ^ auVar19 ^ auVar16;
          *(undefined1 (*) [16])(out + lVar3) = auVar23;
          auVar27 = aesenc(auVar24,(undefined1  [16])local_140);
          auStack_f0 = aesenc(auVar19,auVar24);
          auVar21._0_32_ = ZEXT1632(auStack_f0);
          local_100 = aesenc(auVar6,auVar19);
          auVar17._0_32_ = ZEXT1632(local_100);
          auStack_110 = aesenc(auVar12,auVar6);
          auVar8._0_32_ = ZEXT1632(auStack_110);
          local_120 = aesenc(auVar16,auVar12);
          auVar11._0_32_ = ZEXT1632(local_120);
          auStack_130 = aesenc((undefined1  [16])local_140,auVar16);
          auVar14._0_32_ = ZEXT1632(auStack_130);
          local_140 = (aes_block_t)(auVar27 ^ auVar23);
          lVar4 = lVar3 + 0x10;
          uVar5 = lVar3 + 0x20;
          lVar3 = lVar4;
        } while (uVar5 <= in_len);
      }
      if ((in_len & 0xf) != 0) {
        local_c0 = (undefined1  [16])0x0;
        local_d0 = local_140;
        memcpy(local_c0,in + lVar4,in_len & 0xf);
      }
      auVar23._8_8_ = 0;
      auVar23._0_8_ = in_len;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = ad_len;
      auVar23 = vpunpcklqdq_avx(auVar6,auVar23);
      auVar23 = vpsllq_avx(auVar23,3);
      auVar9 = ZEXT1664(auStack_130);
      auVar15 = ZEXT1664(local_120);
      auVar18 = ZEXT1664(auStack_110);
      auVar26 = ZEXT1664(auStack_f0);
      auVar22 = ZEXT1664(local_100);
      iVar2 = 7;
      do {
        auVar27 = aesenc(auVar26._0_16_,(undefined1  [16])local_140);
        auVar24 = aesenc(auVar22._0_16_,auVar26._0_16_);
        auVar26._0_32_ = ZEXT1632(auVar24);
        auVar19 = aesenc(auVar18._0_16_,auVar22._0_16_);
        auVar22._0_32_ = ZEXT1632(auVar19);
        auVar16 = aesenc(auVar15._0_16_,auVar18._0_16_);
        auVar18._0_32_ = ZEXT1632(auVar16);
        auVar12 = aesenc(auVar9._0_16_,auVar15._0_16_);
        auVar15._0_32_ = ZEXT1632(auVar12);
        auVar6 = aesenc((undefined1  [16])local_140,auVar9._0_16_);
        auVar9._0_32_ = ZEXT1632(auVar6);
        local_140 = (aes_block_t)(auVar23 ^ local_120 ^ auVar27);
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
      local_a0 = auVar19 ^ auVar24 ^ auVar16 ^ auVar12 ^ auVar6 ^ (undefined1  [16])local_140;
      local_120 = ZEXT816(0);
      auStack_110 = ZEXT816(0);
      local_140 = (aes_block_t)ZEXT816(0);
      auStack_130 = ZEXT816(0);
      local_100 = ZEXT816(0);
      auStack_f0 = ZEXT816(0);
      local_c0 = (undefined1  [16])0x0;
      iVar2 = CRYPTO_memcmp(local_a0,in_tag,local_a8);
      if (iVar2 == 0) {
        return 1;
      }
      iVar2 = 0x65;
      line = 0x15a;
    }
    else {
      iVar2 = 0x65;
      line = 0x13a;
    }
  }
  else {
    iVar2 = 0x79;
    line = 0x136;
  }
  ERR_put_error(0x1e,0,iVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_aegis256.cc"
                ,line);
  return 0;
}

Assistant:

static int aead_aegis_256_open_gather(const EVP_AEAD_CTX *ctx, uint8_t *out,
                                      const uint8_t *nonce, size_t nonce_len,
                                      const uint8_t *in, size_t in_len,
                                      const uint8_t *in_tag, size_t in_tag_len,
                                      const uint8_t *ad, size_t ad_len) {
  const struct aead_aegis_256_ctx *aegis_ctx =
      (struct aead_aegis_256_ctx *)&ctx->state;

  return aegis_256_open_gather(aegis_ctx->key, out, nonce, nonce_len, in,
                               in_len, in_tag, in_tag_len, ad, ad_len,
                               ctx->tag_len);
}